

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

void plutovg_matrix_map_rect(plutovg_matrix_t *matrix,plutovg_rect_t *src,plutovg_rect_t *dst)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  plutovg_point_t p [4];
  
  p[0].x = src->x;
  p[0].y = src->y;
  p[1].x = src->w + p[0].x;
  p[1].y = p[0].y;
  p[2].x = p[1].x;
  p[2].y = p[0].y + src->h;
  p[3].x = p[0].x;
  p[3].y = p[2].y;
  fVar6 = matrix->a;
  fVar8 = matrix->b;
  fVar5 = matrix->c;
  fVar4 = matrix->e;
  fVar9 = matrix->d;
  fVar7 = matrix->f;
  lVar3 = 0;
  do {
    fVar1 = p[lVar3].x;
    fVar2 = p[lVar3].y;
    p[lVar3].x = fVar1 * fVar6 + fVar2 * fVar5 + fVar4;
    p[lVar3].y = fVar1 * fVar8 + fVar2 * fVar9 + fVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 1;
  fVar6 = p[0].y;
  fVar8 = p[0].x;
  do {
    fVar5 = p[lVar3].x;
    fVar4 = p[lVar3].y;
    fVar9 = fVar5;
    if (fVar8 <= fVar5) {
      fVar9 = fVar8;
    }
    if (fVar5 <= p[0].x) {
      fVar5 = p[0].x;
    }
    fVar7 = fVar4;
    if (fVar6 <= fVar4) {
      fVar7 = fVar6;
    }
    if (fVar4 <= p[0].y) {
      fVar4 = p[0].y;
    }
    lVar3 = lVar3 + 1;
    p[0].y = fVar4;
    p[0].x = fVar5;
    fVar6 = fVar7;
    fVar8 = fVar9;
  } while (lVar3 != 4);
  dst->x = fVar9;
  dst->y = fVar7;
  dst->w = fVar5 - fVar9;
  dst->h = fVar4 - fVar7;
  return;
}

Assistant:

void plutovg_matrix_map_rect(const plutovg_matrix_t* matrix, const plutovg_rect_t* src, plutovg_rect_t* dst)
{
    plutovg_point_t p[4];
    p[0].x = src->x;
    p[0].y = src->y;
    p[1].x = src->x + src->w;
    p[1].y = src->y;
    p[2].x = src->x + src->w;
    p[2].y = src->y + src->h;
    p[3].x = src->x;
    p[3].y = src->y + src->h;
    plutovg_matrix_map_points(matrix, p, p, 4);

    float l = p[0].x;
    float t = p[0].y;
    float r = p[0].x;
    float b = p[0].y;

    for(int i = 1; i < 4; i++) {
        if(p[i].x < l) l = p[i].x;
        if(p[i].x > r) r = p[i].x;
        if(p[i].y < t) t = p[i].y;
        if(p[i].y > b) b = p[i].y;
    }

    dst->x = l;
    dst->y = t;
    dst->w = r - l;
    dst->h = b - t;
}